

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disk_interface_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_57051::DiskInterfaceTestStatExistingFile::Run
          (DiskInterfaceTestStatExistingFile *this)

{
  Test *pTVar1;
  bool bVar2;
  bool condition;
  TimeStamp TVar3;
  allocator<char> local_61;
  string local_60;
  uint local_40;
  undefined1 local_30 [8];
  string err;
  DiskInterfaceTestStatExistingFile *this_local;
  
  err.field_2._8_8_ = this;
  std::__cxx11::string::string((string *)local_30);
  pTVar1 = g_current_test;
  bVar2 = DiskInterfaceTest::Touch(&this->super_DiskInterfaceTest,"file");
  bVar2 = testing::Test::Check
                    (pTVar1,bVar2,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/disk_interface_test.cc"
                     ,0x53,"Touch(\"file\")");
  pTVar1 = g_current_test;
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"file",&local_61);
    TVar3 = RealDiskInterface::Stat
                      (&(this->super_DiskInterfaceTest).disk_,&local_60,(string *)local_30);
    testing::Test::Check
              (pTVar1,1 < TVar3,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/disk_interface_test.cc"
               ,0x54,"disk_.Stat(\"file\", &err) > 1");
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
    pTVar1 = g_current_test;
    condition = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_30);
    testing::Test::Check
              (pTVar1,condition,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/disk_interface_test.cc"
               ,0x55,"\"\" == err");
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
  }
  local_40 = (uint)!bVar2;
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST_F(DiskInterfaceTest, StatExistingFile) {
  string err;
  ASSERT_TRUE(Touch("file"));
  EXPECT_GT(disk_.Stat("file", &err), 1);
  EXPECT_EQ("", err);
}